

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O3

void __thiscall FFont::Preload(FFont *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  uint uVar4;
  int foo;
  undefined8 uStack_28;
  
  uVar1 = this->FirstChar;
  uVar2 = this->LastChar;
  uStack_28 = (ulong)uVar2;
  if (uVar1 != uVar2) {
    uVar4 = 0x21;
    if (0x21 < (int)uVar1) {
      uVar4 = uVar1;
    }
    if (0x7d < (int)uVar2) {
      uVar2 = 0x7e;
    }
    if ((int)uVar4 < (int)uVar2) {
      do {
        iVar3 = (*this->_vptr_FFont[2])(this,(ulong)uVar4,(long)&uStack_28 + 4);
        if ((FTexture *)CONCAT44(extraout_var,iVar3) != (FTexture *)0x0) {
          FTexture::GetNative((FTexture *)CONCAT44(extraout_var,iVar3),false);
        }
        uVar4 = uVar4 + 1;
        iVar3 = this->LastChar;
        if (0x7d < iVar3) {
          iVar3 = 0x7e;
        }
      } while ((int)uVar4 < iVar3);
    }
  }
  return;
}

Assistant:

void FFont::Preload() const
{
	// First and last char are the same? Wait until it's actually needed
	// since nothing is gained by preloading now.
	if (FirstChar == LastChar)
	{
		return;
	}
	for (int i = MAX(FirstChar, 0x21); i < MIN(LastChar, 0x7e); ++i)
	{
		int foo;
		FTexture *pic = GetChar(i, &foo);
		if (pic != NULL)
		{
			pic->GetNative(false);
		}
	}
}